

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void duckdb::roaring::RoaringFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  RoaringScanState *this;
  RoaringScanState *this_00;
  idx_t in_RDX;
  ColumnSegment *in_stack_00000010;
  RoaringScanState *in_stack_00000018;
  ContainerScanState *container_state;
  idx_t container_idx;
  idx_t internal_offset;
  RoaringScanState scan_state;
  Vector *in_stack_fffffffffffffec8;
  RoaringScanState *this_01;
  idx_t local_f8 [21];
  idx_t in_stack_ffffffffffffffb0;
  idx_t in_stack_ffffffffffffffb8;
  RoaringScanState *in_stack_ffffffffffffffc0;
  
  this_01 = (RoaringScanState *)(local_f8 + 1);
  RoaringScanState::RoaringScanState(in_stack_00000018,in_stack_00000010);
  this = (RoaringScanState *)RoaringScanState::GetContainerIndex(this_01,in_RDX,local_f8);
  this_00 = (RoaringScanState *)
            RoaringScanState::LoadContainer
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                      );
  RoaringScanState::ScanInternal
            (this,(ContainerScanState *)this_01,(idx_t)this_00,in_stack_fffffffffffffec8,0xa04897);
  RoaringScanState::~RoaringScanState(this_00);
  return;
}

Assistant:

void RoaringFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	RoaringScanState scan_state(segment);

	idx_t internal_offset;
	idx_t container_idx = scan_state.GetContainerIndex(static_cast<idx_t>(row_id), internal_offset);
	auto &container_state = scan_state.LoadContainer(container_idx, internal_offset);

	scan_state.ScanInternal(container_state, 1, result, result_idx);
}